

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O3

void compact_int64_suite::fail_array64_int64_missing_length_five(void)

{
  value_type input [4];
  decoder decoder;
  undefined4 local_44;
  value local_40;
  uchar local_3c [4];
  decoder local_38;
  
  local_38.input._M_str = local_3c;
  local_3c[0] = 0xde;
  local_3c[1] = '\b';
  local_3c[2] = '\0';
  local_3c[3] = '\0';
  local_38.input._M_len = 4;
  local_38.current.view._M_len = 0;
  local_38.current.view._M_str = (uchar *)0x0;
  local_38.current.code = end;
  trial::protocol::bintoken::detail::decoder::next(&local_38);
  local_40 = local_38.current.code;
  local_44 = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0xc76,"void compact_int64_suite::fail_array64_int64_missing_length_five()",&local_40,
             &local_44);
  return;
}

Assistant:

void fail_array64_int64_missing_length_five()
{
    const value_type input[] = { token::code::array64_int64, 0x08, 0x00, 0x00 };
    format::detail::decoder decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::end);
}